

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvereal.hpp
# Opt level: O3

void __thiscall
soplex::SoPlexBase<double>::_resolveWithoutPreprocessing
          (SoPlexBase<double> *this,Result simplificationStatus)

{
  SPxSolverBase<double> *this_00;
  SPxScaler<double> *pSVar1;
  VectorBase<double> redCost;
  VectorBase<double> dual;
  VectorBase<double> slacks;
  VectorBase<double> primal;
  
  if (this->_simplifier == (SPxSimplifier<double> *)0x0) {
    if (this->_scaler != (SPxScaler<double> *)0x0) {
      DataArray<soplex::SPxSolverBase<double>::VarStatus>::reSize
                (&this->_basisStatusRows,
                 (this->_realLP->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum);
      DataArray<soplex::SPxSolverBase<double>::VarStatus>::reSize
                (&this->_basisStatusCols,
                 (this->_realLP->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum);
      SPxSolverBase<double>::getBasis
                (&this->_solver,(this->_basisStatusRows).data,(this->_basisStatusCols).data,
                 (this->_basisStatusRows).thesize,(this->_basisStatusCols).thesize);
      this->_hasBasis = true;
    }
  }
  else {
    VectorBase<double>::VectorBase
              (&primal,(this->_solver).super_SPxLPBase<double>.super_LPColSetBase<double>.
                       super_SVSetBase<double>.set.thenum);
    VectorBase<double>::VectorBase
              (&slacks,(this->_solver).super_SPxLPBase<double>.super_LPRowSetBase<double>.
                       super_SVSetBase<double>.set.thenum);
    VectorBase<double>::VectorBase
              (&dual,(this->_solver).super_SPxLPBase<double>.super_LPRowSetBase<double>.
                     super_SVSetBase<double>.set.thenum);
    VectorBase<double>::VectorBase
              (&redCost,(this->_solver).super_SPxLPBase<double>.super_LPColSetBase<double>.
                        super_SVSetBase<double>.set.thenum);
    DataArray<soplex::SPxSolverBase<double>::VarStatus>::reSize
              (&this->_basisStatusRows,
               (this->_realLP->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum);
    DataArray<soplex::SPxSolverBase<double>::VarStatus>::reSize
              (&this->_basisStatusCols,
               (this->_realLP->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum);
    this_00 = &this->_solver;
    SPxSolverBase<double>::getPrimalSol(this_00,&primal);
    SPxSolverBase<double>::getSlacks(this_00,&slacks);
    SPxSolverBase<double>::getDualSol(this_00,&dual);
    SPxSolverBase<double>::getRedCostSol(this_00,&redCost);
    pSVar1 = this->_scaler;
    if ((pSVar1 != (SPxScaler<double> *)0x0) &&
       ((this->_solver).super_SPxLPBase<double>._isScaled == true)) {
      (*pSVar1->_vptr_SPxScaler[0x22])(pSVar1,this_00,&primal);
      (*this->_scaler->_vptr_SPxScaler[0x23])(this->_scaler,this_00,&slacks);
      (*this->_scaler->_vptr_SPxScaler[0x24])(this->_scaler,this_00,&dual);
      (*this->_scaler->_vptr_SPxScaler[0x25])(this->_scaler,this_00,&redCost);
    }
    SPxSolverBase<double>::getBasis
              (this_00,(this->_basisStatusRows).data,(this->_basisStatusCols).data,
               (this->_basisStatusRows).thesize,(this->_basisStatusCols).thesize);
    (*this->_simplifier->_vptr_SPxSimplifier[6])
              (this->_simplifier,&primal,&dual,&slacks,&redCost,(this->_basisStatusRows).data,
               (this->_basisStatusCols).data,0);
    (*this->_simplifier->_vptr_SPxSimplifier[0xf])
              (this->_simplifier,(this->_basisStatusRows).data,(this->_basisStatusCols).data,
               (ulong)(uint)(this->_basisStatusRows).thesize,
               (ulong)(uint)(this->_basisStatusCols).thesize);
    this->_hasBasis = true;
    if (redCost.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(redCost.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)redCost.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)redCost.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (dual.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(dual.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)dual.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)dual.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (slacks.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(slacks.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)slacks.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)slacks.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (primal.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(primal.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)primal.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)primal.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  _preprocessAndSolveReal(this,false,(bool *)0x0);
  return;
}

Assistant:

void SoPlexBase<R>::_resolveWithoutPreprocessing(typename SPxSimplifier<R>::Result
      simplificationStatus)
{
   assert(!_isRealLPLoaded || _scaler != nullptr);
   assert(_simplifier != nullptr || _scaler != nullptr);
   assert(_status == SPxSolverBase<R>::INFEASIBLE || _status == SPxSolverBase<R>::INForUNBD
          || _status == SPxSolverBase<R>::UNBOUNDED);

   // if simplifier was active, then we unsimplify to get the basis
   if(_simplifier)
   {
      assert(!_simplifier->isUnsimplified());
      assert(simplificationStatus == SPxSimplifier<R>::OKAY);

      // get temporary solution vectors for transformed problem
      VectorBase<R> primal(_solver.nCols());
      VectorBase<R> slacks(_solver.nRows());
      VectorBase<R> dual(_solver.nRows());
      VectorBase<R> redCost(_solver.nCols());

      _basisStatusRows.reSize(numRows());
      _basisStatusCols.reSize(numCols());
      assert(_basisStatusRows.size() >= _solver.nRows());
      assert(_basisStatusCols.size() >= _solver.nCols());

      // get solution data from transformed problem
      _solver.getPrimalSol(primal);
      _solver.getSlacks(slacks);
      _solver.getDualSol(dual);
      _solver.getRedCostSol(redCost);

      // unscale vectors
      if(_scaler && _solver.isScaled())
      {
         _scaler->unscalePrimal(_solver, primal);
         _scaler->unscaleSlacks(_solver, slacks);
         _scaler->unscaleDual(_solver, dual);
         _scaler->unscaleRedCost(_solver, redCost);
      }

      // get basis of transformed problem
      _solver.getBasis(_basisStatusRows.get_ptr(), _basisStatusCols.get_ptr(), _basisStatusRows.size(),
                       _basisStatusCols.size());

      try
      {
         _simplifier->unsimplify(primal, dual, slacks, redCost, _basisStatusRows.get_ptr(),
                                 _basisStatusCols.get_ptr(), false);
         _simplifier->getBasis(_basisStatusRows.get_ptr(), _basisStatusCols.get_ptr(),
                               _basisStatusRows.size(), _basisStatusCols.size());
         _hasBasis = true;
      }
      catch(const SPxException& E)
      {
         SPX_MSG_INFO1(spxout, spxout << "Caught exception <" << E.what() <<
                       "> during unsimplification. Resolving without simplifier and scaler.\n");
         _hasBasis = false;
      }
   }
   // if the original problem is not in the solver because of scaling, we also need to store the basis
   else if(_scaler != nullptr)
   {
      _basisStatusRows.reSize(numRows());
      _basisStatusCols.reSize(numCols());
      assert(_basisStatusRows.size() == _solver.nRows());
      assert(_basisStatusCols.size() == _solver.nCols());

      _solver.getBasis(_basisStatusRows.get_ptr(), _basisStatusCols.get_ptr(), _basisStatusRows.size(),
                       _basisStatusCols.size());
      _hasBasis = true;
   }

   // resolve the original problem
   _preprocessAndSolveReal(false);
   return;
}